

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlTextArea.cpp
# Opt level: O0

void __thiscall
Rml::ElementFormControlTextArea::SetWordWrap(ElementFormControlTextArea *this,bool word_wrap)

{
  bool bVar1;
  allocator<char> local_71;
  String local_70;
  allocator<char> local_39;
  String local_38;
  byte local_11;
  ElementFormControlTextArea *pEStack_10;
  bool word_wrap_local;
  ElementFormControlTextArea *this_local;
  
  local_11 = word_wrap;
  pEStack_10 = this;
  bVar1 = GetWordWrap(this);
  if (word_wrap != bVar1) {
    if ((local_11 & 1) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"wrap",&local_71);
      Element::SetAttribute<char[7]>((Element *)this,&local_70,(char (*) [7])"nowrap");
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::allocator<char>::~allocator(&local_71);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"wrap",&local_39);
      Element::RemoveAttribute((Element *)this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
      ::std::allocator<char>::~allocator(&local_39);
    }
  }
  return;
}

Assistant:

void ElementFormControlTextArea::SetWordWrap(bool word_wrap)
{
	if (word_wrap != GetWordWrap())
	{
		if (word_wrap)
			RemoveAttribute("wrap");
		else
			SetAttribute("wrap", "nowrap");
	}
}